

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

String * __thiscall
Diligent::GetShaderCodeBufferDescString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,ShaderCodeBufferDesc *Desc,
          size_t GlobalIdent,size_t MemberIdent)

{
  ostream *poVar1;
  stringstream ss;
  char local_1b9;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  long alStack_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  *(long *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)(int)Desc;
  local_1b9 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Size: ",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  *(long *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = (long)(int)Desc;
  local_1b9 = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b9,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Vars: ",6);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  PrintShaderCodeVariables
            ((stringstream *)local_1b8,(long)&Desc->Size + GlobalIdent,GlobalIdent,
             *(ShaderCodeVariableDesc **)(this + 8),*(Uint32 *)(this + 4));
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

String GetShaderCodeBufferDescString(const ShaderCodeBufferDesc& Desc, size_t GlobalIdent, size_t MemberIdent)
{
    std::stringstream ss;
    ss << std::setw(static_cast<int>(GlobalIdent)) << ' ' << "Size: " << Desc.Size << std::endl
       << std::setw(static_cast<int>(GlobalIdent)) << ' ' << "Vars: " << Desc.NumVariables << std::endl;
    PrintShaderCodeVariables(ss, GlobalIdent + MemberIdent, MemberIdent, Desc.pVariables, Desc.NumVariables);

    return ss.str();
}